

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

int32_t __thiscall
icu_63::Calendar::computeZoneOffset(Calendar *this,double millis,double millisInDay,UErrorCode *ec)

{
  TimeZone *pTVar1;
  int iVar2;
  BasicTimeZone *pBVar3;
  _func_int **pp_Var4;
  int iVar5;
  undefined8 uVar6;
  double dVar7;
  int32_t dstOffset;
  int32_t rawOffset;
  double local_38;
  int32_t tmpDst;
  int32_t tmpRaw;
  
  local_38 = millis + millisInDay;
  pBVar3 = getBasicTimeZone(this);
  if (pBVar3 != (BasicTimeZone *)0x0) {
    (*(pBVar3->super_TimeZone).super_UObject._vptr_UObject[0x14])
              (local_38,pBVar3,
               (ulong)((uint)(this->fSkippedWallTime == UCAL_WALLTIME_FIRST) * 8 + 4),
               (ulong)((uint)(this->fRepeatedWallTime != UCAL_WALLTIME_FIRST) * 8 + 4),&rawOffset,
               &dstOffset,ec);
    goto LAB_001f2d2e;
  }
  pTVar1 = this->fZone;
  (*(pTVar1->super_UObject)._vptr_UObject[6])(local_38,pTVar1,1,&rawOffset,&dstOffset,ec);
  if (this->fRepeatedWallTime == UCAL_WALLTIME_FIRST) {
    (*(pTVar1->super_UObject)._vptr_UObject[6])
              ((local_38 - (double)(dstOffset + rawOffset)) + -21600000.0,pTVar1,0,&tmpRaw,&tmpDst,
               ec);
    iVar2 = dstOffset + rawOffset;
    iVar5 = iVar2 - (tmpRaw + tmpDst);
    if (-1 < iVar5) {
      if (this->fSkippedWallTime != UCAL_WALLTIME_FIRST) goto LAB_001f2d2e;
      goto LAB_001f2ceb;
    }
    dVar7 = local_38 + (double)iVar5;
    pp_Var4 = (pTVar1->super_UObject)._vptr_UObject;
    uVar6 = 1;
  }
  else {
    if (this->fSkippedWallTime != UCAL_WALLTIME_FIRST) goto LAB_001f2d2e;
    iVar2 = dstOffset + rawOffset;
LAB_001f2ceb:
    dVar7 = local_38 - (double)iVar2;
    pp_Var4 = (pTVar1->super_UObject)._vptr_UObject;
    uVar6 = 0;
  }
  (*pp_Var4[6])(dVar7,pTVar1,uVar6,&rawOffset,&dstOffset,ec);
LAB_001f2d2e:
  return dstOffset + rawOffset;
}

Assistant:

int32_t Calendar::computeZoneOffset(double millis, double millisInDay, UErrorCode &ec) {
    int32_t rawOffset, dstOffset;
    UDate wall = millis + millisInDay;
    BasicTimeZone* btz = getBasicTimeZone();
    if (btz) {
        int duplicatedTimeOpt = (fRepeatedWallTime == UCAL_WALLTIME_FIRST) ? BasicTimeZone::kFormer : BasicTimeZone::kLatter;
        int nonExistingTimeOpt = (fSkippedWallTime == UCAL_WALLTIME_FIRST) ? BasicTimeZone::kLatter : BasicTimeZone::kFormer;
        btz->getOffsetFromLocal(wall, nonExistingTimeOpt, duplicatedTimeOpt, rawOffset, dstOffset, ec);
    } else {
        const TimeZone& tz = getTimeZone();
        // By default, TimeZone::getOffset behaves UCAL_WALLTIME_LAST for both.
        tz.getOffset(wall, TRUE, rawOffset, dstOffset, ec);

        UBool sawRecentNegativeShift = FALSE;
        if (fRepeatedWallTime == UCAL_WALLTIME_FIRST) {
            // Check if the given wall time falls into repeated time range
            UDate tgmt = wall - (rawOffset + dstOffset);

            // Any negative zone transition within last 6 hours?
            // Note: The maximum historic negative zone transition is -3 hours in the tz database.
            // 6 hour window would be sufficient for this purpose.
            int32_t tmpRaw, tmpDst;
            tz.getOffset(tgmt - 6*60*60*1000, FALSE, tmpRaw, tmpDst, ec);
            int32_t offsetDelta = (rawOffset + dstOffset) - (tmpRaw + tmpDst);

            U_ASSERT(offsetDelta < -6*60*60*1000);
            if (offsetDelta < 0) {
                sawRecentNegativeShift = TRUE;
                // Negative shift within last 6 hours. When UCAL_WALLTIME_FIRST is used and the given wall time falls
                // into the repeated time range, use offsets before the transition.
                // Note: If it does not fall into the repeated time range, offsets remain unchanged below.
                tz.getOffset(wall + offsetDelta, TRUE, rawOffset, dstOffset, ec);
            }
        }
        if (!sawRecentNegativeShift && fSkippedWallTime == UCAL_WALLTIME_FIRST) {
            // When skipped wall time option is WALLTIME_FIRST,
            // recalculate offsets from the resolved time (non-wall).
            // When the given wall time falls into skipped wall time,
            // the offsets will be based on the zone offsets AFTER
            // the transition (which means, earliest possibe interpretation).
            UDate tgmt = wall - (rawOffset + dstOffset);
            tz.getOffset(tgmt, FALSE, rawOffset, dstOffset, ec);
        }
    }
    return rawOffset + dstOffset;
}